

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O0

int stringindex(context *ctx,char *str,size_t sz)

{
  lua_State *L_00;
  int iVar1;
  lua_Integer lVar2;
  int local_2c;
  int index;
  lua_State *L;
  size_t sz_local;
  char *str_local;
  context *ctx_local;
  
  L_00 = ctx->L;
  lua_pushlstring(L_00,str,sz);
  lua_pushvalue(L_00,-1);
  lua_rawget(L_00,1);
  iVar1 = lua_type(L_00,-1);
  if (iVar1 == 0) {
    local_2c = ctx->string_index + 1;
    ctx->string_index = local_2c;
    lua_settop(L_00,-2);
    lua_pushinteger(L_00,(long)local_2c);
    lua_rawset(L_00,1);
  }
  else {
    lVar2 = lua_tointegerx(L_00,-1,(int *)0x0);
    local_2c = (int)lVar2;
    lua_settop(L_00,-3);
  }
  return local_2c;
}

Assistant:

static int
stringindex(struct context *ctx, const char * str, size_t sz) {
	lua_State *L = ctx->L;
	lua_pushlstring(L, str, sz);
	lua_pushvalue(L, -1);
	lua_rawget(L, 1);
	int index;
	// stringmap(1) str index
	if (lua_isnil(L, -1)) {
		index = ++ctx->string_index;
		lua_pop(L, 1);
		lua_pushinteger(L, index);
		lua_rawset(L, 1);
	} else {
		index = lua_tointeger(L, -1);
		lua_pop(L, 2);
	}
	return index;
}